

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O2

Index __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::degree_u
          (Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this)

{
  int iVar1;
  undefined4 extraout_var;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_18;
  
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::data(&local_18);
  iVar1 = (*((local_18.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_EntryBase)._vptr_EntryBase[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

Index degree_u() const override
    {
        return m_surface_geometry->degree_u();
    }